

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::~Array
          (Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }